

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_group_set_scroll(nk_context *ctx,char *id,nk_uint x_offset,nk_uint y_offset)

{
  nk_window *win;
  long lVar1;
  nk_hash name;
  long lVar2;
  nk_table *pnVar3;
  nk_table *pnVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  nk_uint *unaff_R12;
  bool bVar8;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x49cf,
                  "void nk_group_set_scroll(struct nk_context *, const char *, nk_uint, nk_uint)");
  }
  if (id == (char *)0x0) {
    __assert_fail("id",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x49d0,
                  "void nk_group_set_scroll(struct nk_context *, const char *, nk_uint, nk_uint)");
  }
  win = ctx->current;
  if (win == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x49d1,
                  "void nk_group_set_scroll(struct nk_context *, const char *, nk_uint, nk_uint)");
  }
  if (win->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x49d2,
                  "void nk_group_set_scroll(struct nk_context *, const char *, nk_uint, nk_uint)");
  }
  if (*id == '\0') {
    lVar2 = 0;
  }
  else {
    lVar2 = 0;
    do {
      lVar1 = lVar2 + 1;
      lVar2 = lVar2 + 1;
    } while (id[lVar1] != '\0');
  }
  name = nk_murmur_hash(id,(int)lVar2,2);
  pnVar4 = win->tables;
  pnVar3 = pnVar4;
  do {
    if (pnVar3 == (nk_table *)0x0) {
      unaff_R12 = (nk_uint *)0x0;
      break;
    }
    uVar6 = (ulong)pnVar3->size;
    bVar8 = uVar6 != 0;
    if (uVar6 == 0) {
LAB_0011dc8d:
      pnVar3 = pnVar3->next;
    }
    else {
      if (pnVar3->keys[0] == name) {
        bVar8 = true;
        uVar7 = 0;
      }
      else {
        uVar5 = 0;
        do {
          if (uVar6 - 1 == uVar5) {
            bVar8 = uVar5 + 1 < uVar6;
            goto LAB_0011dc8d;
          }
          uVar7 = uVar5 + 1;
          lVar2 = uVar5 + 1;
          uVar5 = uVar7;
        } while (pnVar3->keys[lVar2] != name);
        bVar8 = uVar7 < uVar6;
      }
      pnVar3->seq = win->seq;
      unaff_R12 = pnVar3->values + uVar7;
    }
  } while (!bVar8);
  if (unaff_R12 == (nk_uint *)0x0) {
    unaff_R12 = nk_add_value(ctx,win,name,(nk_uint)pnVar4);
    pnVar3 = (nk_table *)nk_add_value(ctx,win,name + 1,(nk_uint)pnVar4);
    pnVar3->seq = 0;
    *unaff_R12 = 0;
  }
  else {
    do {
      uVar6 = (ulong)pnVar4->size;
      bVar8 = uVar6 != 0;
      if (uVar6 == 0) {
LAB_0011dcf5:
        pnVar4 = pnVar4->next;
      }
      else {
        if (pnVar4->keys[0] == name + 1) {
          bVar8 = true;
          uVar7 = 0;
        }
        else {
          uVar5 = 0;
          do {
            if (uVar6 - 1 == uVar5) {
              bVar8 = uVar5 + 1 < uVar6;
              goto LAB_0011dcf5;
            }
            uVar7 = uVar5 + 1;
            lVar2 = uVar5 + 1;
            uVar5 = uVar7;
          } while (pnVar4->keys[lVar2] != name + 1);
          bVar8 = uVar7 < uVar6;
        }
        pnVar4->seq = win->seq;
        pnVar3 = (nk_table *)(pnVar4->values + uVar7);
      }
    } while (!bVar8);
  }
  *unaff_R12 = x_offset;
  pnVar3->seq = y_offset;
  return;
}

Assistant:

NK_API void
nk_group_set_scroll(struct nk_context *ctx, const char *id, nk_uint x_offset, nk_uint y_offset)
{
    int id_len;
    nk_hash id_hash;
    struct nk_window *win;
    nk_uint *x_offset_ptr;
    nk_uint *y_offset_ptr;

    NK_ASSERT(ctx);
    NK_ASSERT(id);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout || !id)
        return;

    /* find persistent group scrollbar value */
    win = ctx->current;
    id_len = (int)nk_strlen(id);
    id_hash = nk_murmur_hash(id, (int)id_len, NK_PANEL_GROUP);
    x_offset_ptr = nk_find_value(win, id_hash);
    if (!x_offset_ptr) {
        x_offset_ptr = nk_add_value(ctx, win, id_hash, 0);
        y_offset_ptr = nk_add_value(ctx, win, id_hash+1, 0);

        NK_ASSERT(x_offset_ptr);
        NK_ASSERT(y_offset_ptr);
        if (!x_offset_ptr || !y_offset_ptr) return;
        *x_offset_ptr = *y_offset_ptr = 0;
    } else y_offset_ptr = nk_find_value(win, id_hash+1);
    *x_offset_ptr = x_offset;
    *y_offset_ptr = y_offset;
}